

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

slist * gen_abs_offset_varpart(compiler_state_t *cstate,bpf_abs_offset *off)

{
  int iVar1;
  slist *psVar2;
  
  if (off->is_variable != 0) {
    if (off->reg == -1) {
      iVar1 = alloc_reg(cstate);
      off->reg = iVar1;
    }
    psVar2 = (slist *)newchunk(cstate,0x28);
    (psVar2->s).code = 0x61;
    (psVar2->s).k = off->reg;
    return psVar2;
  }
  return (slist *)0x0;
}

Assistant:

static struct slist *
gen_abs_offset_varpart(compiler_state_t *cstate, bpf_abs_offset *off)
{
	struct slist *s;

	if (off->is_variable) {
		if (off->reg == -1) {
			/*
			 * We haven't yet assigned a register for the
			 * variable part of the offset of the link-layer
			 * header; allocate one.
			 */
			off->reg = alloc_reg(cstate);
		}

		/*
		 * Load the register containing the variable part of the
		 * offset of the link-layer header into the X register.
		 */
		s = new_stmt(cstate, BPF_LDX|BPF_MEM);
		s->s.k = off->reg;
		return s;
	} else {
		/*
		 * That offset isn't variable, there's no variable part,
		 * so we don't need to generate any code.
		 */
		return NULL;
	}
}